

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

string * __thiscall
lest::to_string<Implicit,Implicit>
          (string *__return_storage_ptr__,lest *this,Implicit *lhs,string *op,Implicit *rhs)

{
  ostream *poVar1;
  ForNonContainerNonPointer<Implicit,_std::string> local_1f0;
  ForNonContainerNonPointer<Implicit,_std::string> local_1c0;
  ostringstream local_1a0 [8];
  ostringstream os;
  Implicit *rhs_local;
  string *op_local;
  Implicit *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string<Implicit>(&local_1c0,(Implicit *)this);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string<Implicit>(&local_1f0,(Implicit *)op);
  std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}